

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::ChLoaderXYZnode>::LoadGetStateBlock_w
          (ChLoad<chrono::ChLoaderXYZnode> *this,ChStateDelta *mD)

{
  long *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLoadableUVW,void>
            ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             &(this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_20 + 0x28))(local_20,0,mD);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadGetStateBlock_w(ChStateDelta& mD) {
    this->loader.GetLoadable()->LoadableGetStateBlock_w(0, mD);
}